

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  Types TVar1;
  Variant *pVVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  string *__return_storage_ptr___00;
  bool bVar5;
  int index;
  uint32_t uVar6;
  uint32_t type;
  iterator iVar7;
  SPIRExpression *pSVar8;
  SPIRVariable *var;
  SPIRConstant *c;
  long *plVar9;
  SPIRType *pSVar10;
  const_iterator cVar11;
  mapped_type *pmVar12;
  runtime_error *prVar13;
  undefined7 in_register_00000009;
  size_type *psVar14;
  char **ts_1;
  ulong uVar15;
  size_type sVar16;
  long lVar17;
  pointer pcVar18;
  _Alloc_hider _Var19;
  uint32_t dep;
  uint32_t local_8c;
  string local_88;
  undefined4 local_64;
  string *local_60;
  char *local_58 [2];
  char local_48 [16];
  _Alloc_hider local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000009,register_expression_read);
  this_00 = &(this->super_Compiler).invalid_expressions;
  local_8c = id;
  local_60 = __return_storage_ptr__;
  iVar7 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&this_00->_M_h,&local_8c);
  if (iVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
    handle_invalid_expression(this,local_8c);
  }
  pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar2[local_8c].type == TypeExpression) {
    pSVar8 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + local_8c);
    sVar3 = (pSVar8->expression_dependencies).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar3 != 0) {
      pTVar4 = (pSVar8->expression_dependencies).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar17 = 0;
      do {
        local_88._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)&pTVar4->id + lVar17);
        iVar7 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&this_00->_M_h,(key_type *)&local_88);
        if (iVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
          handle_invalid_expression(this,(uint32_t)local_88._M_dataplus._M_p);
        }
        lVar17 = lVar17 + 4;
      } while (sVar3 << 2 != lVar17);
    }
  }
  if ((char)local_64 != '\0') {
    track_expression_read(this,local_8c);
  }
  __return_storage_ptr___00 = local_60;
  uVar15 = (ulong)local_8c;
  pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  TVar1 = pVVar2[uVar15].type;
  if (9 < TVar1 - TypeVariable) goto switchD_001e4b11_caseD_4;
  pVVar2 = pVVar2 + uVar15;
  switch(TVar1) {
  case TypeVariable:
    var = Variant::get<spirv_cross::SPIRVariable>(pVVar2);
    if ((var->statically_assigned != false) ||
       ((var->loop_variable == true && (var->loop_variable_enable == false)))) {
      uVar6 = (var->static_expression).id;
      if ((uVar6 != 0) || (uVar6 = (var->initializer).id, uVar6 != 0)) {
        to_expression_abi_cxx11_(__return_storage_ptr___00,this,uVar6,true);
        return __return_storage_ptr___00;
      }
      uVar6 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
      type = Compiler::get_variable_data_type_id(&this->super_Compiler,var);
      pSVar8 = emit_uninitialized_temporary_expression(this,type,uVar6);
      (__return_storage_ptr___00->_M_dataplus)._M_p = (pointer)&__return_storage_ptr___00->field_2;
      pcVar18 = (pSVar8->expression)._M_dataplus._M_p;
      sVar16 = (pSVar8->expression)._M_string_length;
LAB_001e4fba:
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr___00,pcVar18,pcVar18 + sVar16);
      return __return_storage_ptr___00;
    }
    if (var->deferred_declaration == true) {
      var->deferred_declaration = false;
      (*(this->super_Compiler)._vptr_Compiler[0x26])(__return_storage_ptr___00,this,var);
      return __return_storage_ptr___00;
    }
    cVar11 = ::std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->flattened_structs)._M_h,&local_8c);
    if (cVar11.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur !=
        (__node_type *)0x0) {
      (*(this->super_Compiler)._vptr_Compiler[6])(&local_88,this,(ulong)local_8c,1);
      pSVar10 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + *(uint *)&(var->super_IVariant).field_0xc);
      load_flattened_struct(__return_storage_ptr___00,this,&local_88,pSVar10);
      goto LAB_001e4e24;
    }
    pmVar12 = ::std::__detail::
              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
    if ((pmVar12->decoration).builtin == true) {
      (*(this->super_Compiler)._vptr_Compiler[0x14])
                (__return_storage_ptr___00,this,(ulong)(pmVar12->decoration).builtin_type,
                 (ulong)var->storage);
      return __return_storage_ptr___00;
    }
    break;
  case TypeConstant:
    c = Variant::get<spirv_cross::SPIRConstant>(pVVar2);
    pSVar10 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(c->super_IVariant).field_0xc);
    bVar5 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(c->super_IVariant).self.id,DecorationBuiltIn);
    if (bVar5) {
      uVar6 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(c->super_IVariant).self.id,DecorationBuiltIn);
      (*(this->super_Compiler)._vptr_Compiler[0x14])(__return_storage_ptr___00,this,(ulong)uVar6,8);
      return __return_storage_ptr___00;
    }
    if (c->specialization == true) {
      if (((this->backend).workgroup_size_is_hidden == true) &&
         (index = get_constant_mapping_to_workgroup_component(this,c), -1 < index)) {
        ts_1 = (char **)0x1;
        (*(this->super_Compiler)._vptr_Compiler[0x14])(&local_88,this,0x19);
        local_38._M_p = vector_swizzle(1,index);
        join<std::__cxx11::string,char_const*>
                  (__return_storage_ptr___00,(spirv_cross *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
                   ts_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        if (*(int *)&(pSVar10->super_IVariant).field_0xc == 8) {
          return __return_storage_ptr___00;
        }
        bitcast_expression(&local_88,this,pSVar10,UInt,__return_storage_ptr___00);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr___00,(string *)&local_88);
        _Var19._M_p = local_88._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == &local_88.field_2) {
          return __return_storage_ptr___00;
        }
        goto LAB_001e4e36;
      }
    }
    else if (((c->is_used_as_lut != true) &&
             ((*(int *)&(pSVar10->super_IVariant).field_0xc != 0xf ||
              ((this->backend).can_declare_struct_inline != false)))) &&
            (((pSVar10->array).super_VectorView<unsigned_int>.buffer_size == 0 ||
             ((this->backend).can_declare_arrays_inline != false)))) {
      constant_expression_abi_cxx11_(__return_storage_ptr___00,this,c,false);
      return __return_storage_ptr___00;
    }
    break;
  default:
    goto switchD_001e4b11_caseD_4;
  case TypeExpression:
    pSVar8 = Variant::get<spirv_cross::SPIRExpression>(pVVar2);
    uVar6 = *(uint32_t *)&(pSVar8->super_IVariant).field_0xc;
    if (uVar6 == 0) {
      if (pSVar8->need_transpose == true) {
        uVar6 = Compiler::get_extended_decoration
                          (&this->super_Compiler,local_8c,SPIRVCrossDecorationPhysicalTypeID);
        bVar5 = Compiler::has_extended_decoration
                          (&this->super_Compiler,local_8c,SPIRVCrossDecorationPhysicalTypePacked);
        pcVar18 = (pSVar8->expression)._M_dataplus._M_p;
        local_58[0] = local_48;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,pcVar18,pcVar18 + (pSVar8->expression)._M_string_length);
        pSVar10 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + (pSVar8->expression_type).id);
        (*(this->super_Compiler)._vptr_Compiler[0x29])
                  (__return_storage_ptr___00,this,local_58,pSVar10,(ulong)uVar6,(ulong)bVar5);
        _Var19._M_p = local_58[0];
        if (local_58[0] == local_48) {
          return __return_storage_ptr___00;
        }
        goto LAB_001e4e36;
      }
      cVar11 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->flattened_structs)._M_h,&local_8c);
      if (cVar11.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur !=
          (__node_type *)0x0) {
        pSVar10 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + (pSVar8->expression_type).id);
        load_flattened_struct(__return_storage_ptr___00,this,&pSVar8->expression,pSVar10);
        return __return_storage_ptr___00;
      }
      bVar5 = Compiler::is_forcing_recompilation(&this->super_Compiler);
      if (bVar5) {
        (__return_storage_ptr___00->_M_dataplus)._M_p = (pointer)&__return_storage_ptr___00->field_2
        ;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr___00,"_","");
        return __return_storage_ptr___00;
      }
      (__return_storage_ptr___00->_M_dataplus)._M_p = (pointer)&__return_storage_ptr___00->field_2;
      pcVar18 = (pSVar8->expression)._M_dataplus._M_p;
      sVar16 = (pSVar8->expression)._M_string_length;
      goto LAB_001e4fba;
    }
    to_enclosed_expression_abi_cxx11_(&local_88,this,uVar6,true);
    plVar9 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_88,(ulong)(pSVar8->expression)._M_dataplus._M_p);
    (__return_storage_ptr___00->_M_dataplus)._M_p = (pointer)&__return_storage_ptr___00->field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar14) {
      lVar17 = plVar9[3];
      (__return_storage_ptr___00->field_2)._M_allocated_capacity = *psVar14;
      *(long *)((long)&__return_storage_ptr___00->field_2 + 8) = lVar17;
    }
    else {
      (__return_storage_ptr___00->_M_dataplus)._M_p = (pointer)*plVar9;
      (__return_storage_ptr___00->field_2)._M_allocated_capacity = *psVar14;
    }
    __return_storage_ptr___00->_M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
LAB_001e4e24:
    _Var19._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr___00;
    }
LAB_001e4e36:
    operator_delete(_Var19._M_p);
    return __return_storage_ptr___00;
  case TypeCombinedImageSampler:
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Combined image samplers have no default expression representation.","");
    ::std::runtime_error::runtime_error(prVar13,(string *)&local_88);
    *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case TypeAccessChain:
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Access chains have no default expression representation.","");
    ::std::runtime_error::runtime_error(prVar13,(string *)&local_88);
    *(undefined ***)prVar13 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar15 = (ulong)local_8c;
switchD_001e4b11_caseD_4:
  (*(this->super_Compiler)._vptr_Compiler[6])(__return_storage_ptr___00,this,uVar15,1);
  return __return_storage_ptr___00;
}

Assistant:

string CompilerGLSL::to_expression(uint32_t id, bool register_expression_read)
{
	auto itr = invalid_expressions.find(id);
	if (itr != end(invalid_expressions))
		handle_invalid_expression(id);

	if (ir.ids[id].get_type() == TypeExpression)
	{
		// We might have a more complex chain of dependencies.
		// A possible scenario is that we
		//
		// %1 = OpLoad
		// %2 = OpDoSomething %1 %1. here %2 will have a dependency on %1.
		// %3 = OpDoSomethingAgain %2 %2. Here %3 will lose the link to %1 since we don't propagate the dependencies like that.
		// OpStore %1 %foo // Here we can invalidate %1, and hence all expressions which depend on %1. Only %2 will know since it's part of invalid_expressions.
		// %4 = OpDoSomethingAnotherTime %3 %3 // If we forward all expressions we will see %1 expression after store, not before.
		//
		// However, we can propagate up a list of depended expressions when we used %2, so we can check if %2 is invalid when reading %3 after the store,
		// and see that we should not forward reads of the original variable.
		auto &expr = get<SPIRExpression>(id);
		for (uint32_t dep : expr.expression_dependencies)
			if (invalid_expressions.find(dep) != end(invalid_expressions))
				handle_invalid_expression(dep);
	}

	if (register_expression_read)
		track_expression_read(id);

	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		if (e.base_expression)
			return to_enclosed_expression(e.base_expression) + e.expression;
		else if (e.need_transpose)
		{
			// This should not be reached for access chains, since we always deal explicitly with transpose state
			// when consuming an access chain expression.
			uint32_t physical_type_id = get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
			bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);
			return convert_row_major_matrix(e.expression, get<SPIRType>(e.expression_type), physical_type_id,
			                                is_packed);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(e.expression, get<SPIRType>(e.expression_type));
		}
		else
		{
			if (is_forcing_recompilation())
			{
				// During first compilation phase, certain expression patterns can trigger exponential growth of memory.
				// Avoid this by returning dummy expressions during this phase.
				// Do not use empty expressions here, because those are sentinels for other cases.
				return "_";
			}
			else
				return e.expression;
		}
	}

	case TypeConstant:
	{
		auto &c = get<SPIRConstant>(id);
		auto &type = get<SPIRType>(c.constant_type);

		// WorkGroupSize may be a constant.
		if (has_decoration(c.self, DecorationBuiltIn))
			return builtin_to_glsl(BuiltIn(get_decoration(c.self, DecorationBuiltIn)), StorageClassGeneric);
		else if (c.specialization)
		{
			if (backend.workgroup_size_is_hidden)
			{
				int wg_index = get_constant_mapping_to_workgroup_component(c);
				if (wg_index >= 0)
				{
					auto wg_size = join(builtin_to_glsl(BuiltInWorkgroupSize, StorageClassInput), vector_swizzle(1, wg_index));
					if (type.basetype != SPIRType::UInt)
						wg_size = bitcast_expression(type, SPIRType::UInt, wg_size);
					return wg_size;
				}
			}

			return to_name(id);
		}
		else if (c.is_used_as_lut)
			return to_name(id);
		else if (type.basetype == SPIRType::Struct && !backend.can_declare_struct_inline)
			return to_name(id);
		else if (!type.array.empty() && !backend.can_declare_arrays_inline)
			return to_name(id);
		else
			return constant_expression(c);
	}

	case TypeConstantOp:
		return to_name(id);

	case TypeVariable:
	{
		auto &var = get<SPIRVariable>(id);
		// If we try to use a loop variable before the loop header, we have to redirect it to the static expression,
		// the variable has not been declared yet.
		if (var.statically_assigned || (var.loop_variable && !var.loop_variable_enable))
		{
			// We might try to load from a loop variable before it has been initialized.
			// Prefer static expression and fallback to initializer.
			if (var.static_expression)
				return to_expression(var.static_expression);
			else if (var.initializer)
				return to_expression(var.initializer);
			else
			{
				// We cannot declare the variable yet, so have to fake it.
				uint32_t undef_id = ir.increase_bound_by(1);
				return emit_uninitialized_temporary_expression(get_variable_data_type_id(var), undef_id).expression;
			}
		}
		else if (var.deferred_declaration)
		{
			var.deferred_declaration = false;
			return variable_decl(var);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(to_name(id), get<SPIRType>(var.basetype));
		}
		else
		{
			auto &dec = ir.meta[var.self].decoration;
			if (dec.builtin)
				return builtin_to_glsl(dec.builtin_type, var.storage);
			else
				return to_name(id);
		}
	}

	case TypeCombinedImageSampler:
		// This type should never be taken the expression of directly.
		// The intention is that texture sampling functions will extract the image and samplers
		// separately and take their expressions as needed.
		// GLSL does not use this type because OpSampledImage immediately creates a combined image sampler
		// expression ala sampler2D(texture, sampler).
		SPIRV_CROSS_THROW("Combined image samplers have no default expression representation.");

	case TypeAccessChain:
		// We cannot express this type. They only have meaning in other OpAccessChains, OpStore or OpLoad.
		SPIRV_CROSS_THROW("Access chains have no default expression representation.");

	default:
		return to_name(id);
	}
}